

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

void __thiscall
CoreML::Specification::WeightParams::_internal_add_floatvalue(WeightParams *this,float value)

{
  RepeatedField<float> *this_00;
  uint uVar1;
  float *pfVar2;
  
  this_00 = &this->floatvalue_;
  uVar1 = (this->floatvalue_).current_size_;
  if (uVar1 == (this->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(this_00,uVar1 + 1);
    pfVar2 = google::protobuf::RepeatedField<float>::elements(this_00);
    pfVar2[uVar1] = value;
  }
  else {
    pfVar2 = google::protobuf::RepeatedField<float>::elements(this_00);
    pfVar2[uVar1] = value;
  }
  this_00->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void WeightParams::_internal_add_floatvalue(float value) {
  floatvalue_.Add(value);
}